

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh4asm_test.c
# Opt level: O0

_Bool test_inst(char *inst)

{
  uint16_t inst_00 [1];
  int iVar1;
  size_t sVar2;
  char *local_30;
  char *new_inst;
  uint16_t inst_bin;
  size_t len;
  char *inst_local;
  
  sVar2 = strlen(inst);
  if (sVar2 == 0) {
    errx(1,"empty instruction (this is a proble with the test)");
  }
  if (inst[sVar2 - 1] != '\n') {
    errx(1,"instructions need to end with newlines (this is a problem with the test)");
  }
  printf("about to test %s",inst);
  clear_bin();
  sh4asm_set_emitter(neo_bin_emit);
  len = (size_t)inst;
  while (inst_00[0] = sh4asm_buf[0], *(char *)len != '\0') {
    iVar1 = tolower((int)*(char *)len);
    sh4asm_input_char((char)iVar1);
    len = len + 1;
  }
  if (sh4asm_buf_len == 1) {
    clear_asm();
    sh4asm_disas_inst(inst_00[0],neo_asm_emit,0);
    neo_asm_emit('\n');
    neo_asm_emit('\0');
    local_30 = sh4asm_disas;
    printf("The returned instruction was %s",sh4asm_disas);
    clear_bin();
    sh4asm_set_emitter(neo_bin_emit);
    while (*local_30 != '\0') {
      sh4asm_input_char(*local_30);
      local_30 = local_30 + 1;
    }
    if (sh4asm_buf_len == 1) {
      if (sh4asm_buf[0] == inst_00[0]) {
        printf("success!\n");
        inst_local._7_1_ = true;
      }
      else {
        printf("Error: first assembly returned 0x%04x, second assembly returned 0x%04x\n",
               (ulong)inst_00[0],(ulong)sh4asm_buf[0]);
        inst_local._7_1_ = false;
      }
    }
    else {
      printf("invalid sh4asm output length (expected 1, got %u)\n",(ulong)sh4asm_buf_len);
      inst_local._7_1_ = false;
    }
  }
  else {
    printf("invalid sh4asm output length (expected 1, got %u)\n",(ulong)sh4asm_buf_len);
    inst_local._7_1_ = false;
  }
  return inst_local._7_1_;
}

Assistant:

bool test_inst(char const *inst) {
    size_t len = strlen(inst);

    if (!len)
        errx(1, "empty instruction (this is a proble with the test)");
    if (inst[len - 1] != '\n') {
        errx(1, "instructions need to end with newlines (this is a problem "
             "with the test)");
    }

    printf("about to test %s", inst);

    // first assemble the instruction
    clear_bin();
    sh4asm_set_emitter(neo_bin_emit);
    while (*inst)
        sh4asm_input_char(tolower(*inst++));
    if (sh4asm_buf_len != 1) {
        printf("invalid sh4asm output length (expected 1, got %u)\n",
               sh4asm_buf_len);
        return false;
    }
    uint16_t inst_bin = sh4asm_buf[0];

    // now disassemble it
    clear_asm();
    sh4asm_disas_inst(inst_bin, neo_asm_emit, 0);

    // add in a newline
    neo_asm_emit('\n');
    neo_asm_emit('\0');

    char const *new_inst = sh4asm_disas;

    printf("The returned instruction was %s", new_inst);

    // now reassemble the instruction
    clear_bin();
    sh4asm_set_emitter(neo_bin_emit);
    while (*new_inst)
        sh4asm_input_char(*new_inst++);
    if (sh4asm_buf_len != 1) {
        printf("invalid sh4asm output length (expected 1, got %u)\n",
               sh4asm_buf_len);
        return false;
    }

    if (sh4asm_buf[0] != inst_bin) {
        printf("Error: first assembly returned 0x%04x, second assembly "
               "returned 0x%04x\n",
               (unsigned)inst_bin, (unsigned)sh4asm_buf[0]);
        return false;
    }

    printf("success!\n");

    return true;
}